

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Label * __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::GetNearestTryLabel
          (BinaryReaderInterp *this,Index depth)

{
  Label *pLVar1;
  size_type sVar2;
  reference pvVar3;
  Label *label;
  size_t i;
  Index depth_local;
  BinaryReaderInterp *this_local;
  
  label = (Label *)(ulong)depth;
  while( true ) {
    pLVar1 = (Label *)std::
                      vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                      ::size(&this->label_stack_);
    if (pLVar1 <= label) {
      return (Label *)0x0;
    }
    sVar2 = std::
            vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
            ::size(&this->label_stack_);
    pvVar3 = std::
             vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ::operator[](&this->label_stack_,(sVar2 - (long)label) - 1);
    if (pvVar3->kind == Try) break;
    label = (Label *)((long)&label->kind + 1);
  }
  return pvVar3;
}

Assistant:

Label* BinaryReaderInterp::GetNearestTryLabel(Index depth) {
  for (size_t i = depth; i < label_stack_.size(); i++) {
    Label* label = &label_stack_[label_stack_.size() - i - 1];
    if (label->kind == LabelKind::Try) {
      return label;
    }
  }
  return nullptr;
}